

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeXMLWriter.cpp
# Opt level: O2

Writer * __thiscall xe::xml::Writer::operator<<(Writer *this,Attribute *attribute)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(this->m_rawDst," ");
  poVar1 = std::operator<<(poVar1,(string *)attribute);
  poVar1 = std::operator<<(poVar1,"=\"");
  poVar1 = std::operator<<(poVar1,(string *)&attribute->value);
  std::operator<<(poVar1,"\"");
  return this;
}

Assistant:

Writer& Writer::operator<< (const Attribute& attribute)
{
	DE_ASSERT(m_state == STATE_ELEMENT);

	// \todo [2012-09-05 pyry] Escape?
	m_rawDst << " " << attribute.name << "=\"" << attribute.value << "\"";

	return *this;
}